

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# G1.c
# Opt level: O0

void G1_makeaffine(G1 *op,ATE_CTX *ctx)

{
  int iVar1;
  fp_struct_st *in_RSI;
  fp_struct_st *in_RDI;
  fp_t dummy;
  fp_struct_st *in_stack_ffffffffffffffc8;
  fp_struct_st *in_stack_ffffffffffffffd0;
  fp_struct_st *in_stack_ffffffffffffffd8;
  ATE_CTX *in_stack_ffffffffffffffe0;
  fp_struct_st *in_stack_ffffffffffffffe8;
  
  iVar1 = fp_iszero(in_RDI + 2);
  if (iVar1 == 0) {
    fp_invert(in_RSI,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
    fp_mul((fp_struct_st *)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
           in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,(fp_struct_st *)0x125948);
    fp_mul((fp_struct_st *)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
           in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,(fp_struct_st *)0x125972);
    fp_mul((fp_struct_st *)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
           in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,(fp_struct_st *)0x1259a4);
    fp_mul((fp_struct_st *)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
           in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,(fp_struct_st *)0x1259d6);
    fp_mul((fp_struct_st *)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
           in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,(fp_struct_st *)0x125a08);
    fp_setone(in_RDI + 2,(fp_struct_st *)(in_RSI[0x18].d + 2));
  }
  else {
    fp_setzero(in_RDI);
    fp_setone(in_RDI + 1,(fp_struct_st *)(in_RSI[0x18].d + 2));
    fp_setzero(in_RDI + 2);
  }
  return;
}

Assistant:

void G1_makeaffine(G1 *op, const ATE_CTX *ctx)
{
    fp_t dummy;
    if(fp_iszero(op->m_z))
    {
        fp_setzero(op->m_x);
        fp_setone(op->m_y, ctx->rp);
        fp_setzero(op->m_z);
    }
    else
    {
        fp_invert(dummy, op->m_z, ctx);
        fp_mul(op->m_x, op->m_x, dummy, ctx->p, ctx->n0);
        fp_mul(op->m_x, op->m_x, dummy, ctx->p, ctx->n0);

        fp_mul(op->m_y, op->m_y, dummy, ctx->p, ctx->n0);
        fp_mul(op->m_y, op->m_y, dummy, ctx->p, ctx->n0);
        fp_mul(op->m_y, op->m_y, dummy, ctx->p, ctx->n0);

        fp_setone(op->m_z, ctx->rp);
    }
}